

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O0

uchar * fl_read_image(uchar *p,int X,int Y,int w,int h,int alpha)

{
  Fl_Window *pFVar1;
  Fl_RGB_Image *pFVar2;
  uchar *image_data;
  Fl_RGB_Image *img;
  int alpha_local;
  int h_local;
  int w_local;
  int Y_local;
  int X_local;
  uchar *p_local;
  
  if ((w < 0) || (pFVar1 = fl_find(fl_window), pFVar1 == (Fl_Window *)0x0)) {
    p_local = read_win_rectangle(p,X,Y,w,h,alpha);
  }
  else {
    pFVar1 = Fl_Window::current();
    pFVar2 = traverse_to_gl_subwindows(&pFVar1->super_Fl_Group,p,X,Y,w,h,alpha,(Fl_RGB_Image *)0x0);
    p_local = pFVar2->array;
    pFVar2->alloc_array = 0;
    if (pFVar2 != (Fl_RGB_Image *)0x0) {
      (*(pFVar2->super_Fl_Image)._vptr_Fl_Image[1])();
    }
  }
  return p_local;
}

Assistant:

uchar *				// O - Pixel buffer or NULL if failed
fl_read_image(uchar *p,		// I - Pixel buffer or NULL to allocate
              int   X,		// I - Left position
              int   Y,		// I - Top position
              int   w,		// I - Width of area to read
              // negative allows capture of window title bar and frame (X11 only)
              int   h,		// I - Height of area to read
              int   alpha)// I - Alpha value for image (0 for none)
{
  if (w < 0 || fl_find(fl_window) == 0) { // read from off_screen buffer or title bar and frame
    return read_win_rectangle(p, X, Y, w, h, alpha); // this function has an X11 and a WIN32 version
  }
  Fl_RGB_Image *img = traverse_to_gl_subwindows(Fl_Window::current(), p, X, Y, w, h, alpha, NULL);
  uchar *image_data = (uchar*)img->array;
  img->alloc_array = 0;
  delete img;
  return image_data;
}